

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

invalid_iterator * __thiscall
nlohmann::detail::invalid_iterator::
create<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (invalid_iterator *__return_storage_ptr__,invalid_iterator *this,int id_,string *what_arg,
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *context)

{
  char *what_arg_00;
  undefined4 in_register_00000014;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *leaf_element;
  string local_e0;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string w;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *context_local;
  string *what_arg_local;
  int id__local;
  
  w.field_2._8_8_ = what_arg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"invalid_iterator",&local_a9);
  exception::name(&local_88,&local_a8,(int)this);
  exception::
  diagnostics<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_e0,(exception *)w.field_2._8_8_,leaf_element);
  std::operator+(&local_68,&local_88,&local_e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 &local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_register_00000014,id_));
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  what_arg_00 = (char *)std::__cxx11::string::c_str();
  invalid_iterator(__return_storage_ptr__,(int)this,what_arg_00);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

static invalid_iterator create(int id_, const std::string& what_arg, const BasicJsonType& context)
    {
        std::string w = exception::name("invalid_iterator", id_) + exception::diagnostics(context) + what_arg;
        return invalid_iterator(id_, w.c_str());
    }